

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderRemoveNode(ImGuiID node_id)

{
  ImGuiContext_conflict *ctx_00;
  bool bVar1;
  ImGuiDockNode *pIVar2;
  ImGuiDockNode *node;
  ImGuiContext_conflict *ctx;
  ImGuiID node_id_local;
  
  ctx_00 = GImGui;
  pIVar2 = DockContextFindNodeByID(GImGui,node_id);
  if (pIVar2 != (ImGuiDockNode *)0x0) {
    DockBuilderRemoveNodeDockedWindows(node_id,true);
    DockBuilderRemoveNodeChildNodes(node_id);
    pIVar2 = DockContextFindNodeByID(ctx_00,node_id);
    if (pIVar2 != (ImGuiDockNode *)0x0) {
      bVar1 = ImGuiDockNode::IsCentralNode(pIVar2);
      if ((bVar1) && (pIVar2->ParentNode != (ImGuiDockNode *)0x0)) {
        ImGuiDockNode::SetLocalFlags(pIVar2->ParentNode,pIVar2->ParentNode->LocalFlags | 0x800);
      }
      DockContextRemoveNode(ctx_00,pIVar2,true);
    }
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNode(ImGuiID node_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    DockBuilderRemoveNodeDockedWindows(node_id, true);
    DockBuilderRemoveNodeChildNodes(node_id);
    // Node may have moved or deleted if e.g. any merge happened
    node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    if (node->IsCentralNode() && node->ParentNode)
        node->ParentNode->SetLocalFlags(node->ParentNode->LocalFlags | ImGuiDockNodeFlags_CentralNode);
    DockContextRemoveNode(ctx, node, true);
}